

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.h
# Opt level: O3

void ast::Sections::append8(uint section,uint8_t b)

{
  Section *this;
  
  if ((ulong)section < (ulong)(DAT_0013da98 - table >> 3)) {
    this = *(Section **)(table + (ulong)section * 8);
    Section::write8(this,this->content_size,b);
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

static void append8(unsigned section, uint8_t b) {
		table.at(section)->append8(b);
	}